

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O3

void Psr_ManWriteBlif(char *pFileName,Vec_Ptr_t *vPrs)

{
  int iVar1;
  int iVar2;
  Psr_Ntk_t *p;
  int *piVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  
  if (vPrs->nSize < 1) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)*vPrs->pArray;
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
    return;
  }
  pcVar5 = Abc_NamStr(*(Abc_Nam_t **)(piVar10 + 2),*piVar10);
  Extra_TimeStamp();
  fprintf(__stream,"# Design \"%s\" written by ABC on %s\n\n",pcVar5);
  if (0 < vPrs->nSize) {
    lVar7 = 0;
    do {
      p = (Psr_Ntk_t *)vPrs->pArray[lVar7];
      pcVar5 = Abc_NamStr(p->pStrs,p->iModuleName);
      fprintf(__stream,".model %s\n",pcVar5);
      if (((p->vInouts).nSize != 0) && (fwrite(".inouts",7,1,__stream), (p->vInouts).nSize != 0)) {
        Psr_ManWriteBlifArray((FILE *)__stream,p,&p->vInouts);
      }
      fwrite(".inputs",7,1,__stream);
      Psr_ManWriteBlifArray((FILE *)__stream,p,&p->vInputs);
      fwrite(".outputs",8,1,__stream);
      Psr_ManWriteBlifArray((FILE *)__stream,p,&p->vOutputs);
      if (0 < (p->vObjs).nSize) {
        lVar9 = 0;
        do {
          piVar10 = (p->vObjs).pArray;
          iVar1 = piVar10[lVar9];
          if (((long)iVar1 < 0) || (uVar4 = (p->vBoxes).nSize, (int)uVar4 <= iVar1)) {
LAB_00335faf:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar3 = (p->vBoxes).pArray;
          Psr_BoxSignals_V_1 = piVar3[iVar1] - 2;
          iVar2 = piVar10[lVar9];
          if (((long)iVar2 < -3) || (uVar4 <= iVar2 + 3U)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          Psr_BoxSignals_V_2 = piVar3 + (iVar2 + 3U);
          if (((((p->vObjs).nSize <= lVar9) || (iVar2 < -1)) || (uVar4 <= iVar2 + 1U)) ||
             (iVar2 < 0)) goto LAB_00335faf;
          if (piVar3[iVar2] < 4) {
            __assert_fail("Psr_BoxIONum(p, i) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacWriteBlif.c"
                          ,0x3d,"void Psr_ManWriteBlifLines(FILE *, Psr_Ntk_t *)");
          }
          if ((piVar3[iVar1] & 1U) != 0) {
            __assert_fail("Vec_IntSize(vBox) % 2 == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacWriteBlif.c"
                          ,0x3e,"void Psr_ManWriteBlifLines(FILE *, Psr_Ntk_t *)");
          }
          iVar1 = piVar3[iVar2 + 1U];
          if (iVar1 == -1) {
            fwrite(".latch",6,1,__stream);
            if (Psr_BoxSignals_V_1 < 2) goto LAB_00335faf;
            pcVar5 = Abc_NamStr(p->pStrs,Psr_BoxSignals_V_2[1]);
            fprintf(__stream," %s",pcVar5);
            if (Psr_BoxSignals_V_1 < 4) goto LAB_00335faf;
            pcVar5 = Abc_NamStr(p->pStrs,Psr_BoxSignals_V_2[3]);
            fprintf(__stream," %s",pcVar5);
            if ((((p->vObjs).nSize <= lVar9) || (iVar1 = (p->vObjs).pArray[lVar9], iVar1 < -2)) ||
               (uVar4 = iVar1 + 2, (p->vBoxes).nSize <= (int)uVar4)) goto LAB_00335faf;
            fprintf(__stream," %c\n",(ulong)((p->vBoxes).pArray[uVar4] + 0x30));
          }
          else if (*Psr_BoxSignals_V_2 == 0) {
            fwrite(".names",6,1,__stream);
            if (1 < Psr_BoxSignals_V_1) {
              lVar8 = 1;
              do {
                pcVar5 = Abc_NamStr(p->pStrs,Psr_BoxSignals_V_2[lVar8]);
                fprintf(__stream," %s",pcVar5);
                lVar8 = lVar8 + 2;
              } while ((int)lVar8 < Psr_BoxSignals_V_1);
            }
            pcVar5 = Abc_NamStr(p->pStrs,iVar1);
            fprintf(__stream,"\n%s",pcVar5);
          }
          else {
            fwrite(".subckt",7,1,__stream);
            pcVar5 = Abc_NamStr(p->pStrs,iVar1);
            fprintf(__stream," %s",pcVar5);
            if (1 < Psr_BoxSignals_V_1) {
              lVar8 = 1;
              do {
                iVar1 = Psr_BoxSignals_V_2[lVar8];
                pcVar5 = Abc_NamStr(p->pStrs,Psr_BoxSignals_V_2[lVar8 + -1]);
                pcVar6 = Abc_NamStr(p->pStrs,iVar1);
                fprintf(__stream," %s=%s",pcVar5,pcVar6);
                lVar8 = lVar8 + 2;
              } while ((int)lVar8 < Psr_BoxSignals_V_1);
            }
            fputc(10,__stream);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < (p->vObjs).nSize);
      }
      fwrite(".end\n\n",6,1,__stream);
      lVar7 = lVar7 + 1;
    } while (lVar7 < vPrs->nSize);
  }
  fclose(__stream);
  return;
}

Assistant:

void Psr_ManWriteBlif( char * pFileName, Vec_Ptr_t * vPrs )
{
    Psr_Ntk_t * pNtk = Psr_ManRoot(vPrs);
    FILE * pFile = fopen( pFileName, "wb" ); int i;
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "# Design \"%s\" written by ABC on %s\n\n", Psr_NtkStr(pNtk, pNtk->iModuleName), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Psr_Ntk_t *, vPrs, pNtk, i )
        Psr_ManWriteBlifNtk( pFile, pNtk );
    fclose( pFile );
}